

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::to_initializer_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  SPIRConstant *c_00;
  SPIRConstant *c;
  bool is_block;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar3->super_IVariant).self.id,DecorationBlock);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var->initializer);
  c_00 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar2);
  if ((bVar1) && (c_00 != (SPIRConstant *)0x0)) {
    CompilerGLSL::constant_expression_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,c_00,false,false);
  }
  else {
    CompilerGLSL::to_initializer_expression_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,var);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::to_initializer_expression(const SPIRVariable &var)
{
	// We cannot emit static const initializer for block constants for practical reasons,
	// so just inline the initializer.
	// FIXME: There is a theoretical problem here if someone tries to composite extract
	// into this initializer since we don't declare it properly, but that is somewhat non-sensical.
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	auto *c = maybe_get<SPIRConstant>(var.initializer);
	if (is_block && c)
		return constant_expression(*c);
	else
		return CompilerGLSL::to_initializer_expression(var);
}